

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O1

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::StartNewSlab
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  uint uVar1;
  uint uVar2;
  size_t __size;
  void *NewSlab;
  char *local_28;
  
  uVar1 = (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
          super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size >> 7;
  uVar2 = 0x1e;
  if (uVar1 < 0x1e) {
    uVar2 = uVar1;
  }
  __size = 0x1000L << ((byte)uVar2 & 0x3f);
  local_28 = (char *)malloc(__size);
  if (local_28 == (char *)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  SmallVectorTemplateBase<void_*,_true>::push_back
            ((SmallVectorTemplateBase<void_*,_true> *)&this->Slabs,&local_28);
  this->CurPtr = local_28;
  this->End = local_28 + __size;
  return;
}

Assistant:

void StartNewSlab() {
    size_t AllocatedSlabSize = computeSlabSize(Slabs.size());

    void *NewSlab = Allocator.Allocate(AllocatedSlabSize, 0);
    // We own the new slab and don't want anyone reading anything other than
    // pieces returned from this method.  So poison the whole slab.
    __asan_poison_memory_region(NewSlab, AllocatedSlabSize);

    Slabs.push_back(NewSlab);
    CurPtr = (char *)(NewSlab);
    End = ((char *)NewSlab) + AllocatedSlabSize;
  }